

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

Instr * __thiscall Lowerer::LowerBailOnNotSpreadable(Lowerer *this,Instr *instr)

{
  Instr *pIVar1;
  Func *func;
  bool bVar2;
  ObjectType OVar3;
  Opnd *opnd;
  RegOpnd *baseOpnd;
  LabelInstr *isNotObjectLabel;
  IndirOpnd *pIVar4;
  IntConstOpnd *pIVar5;
  LabelInstr *target;
  undefined1 *puVar6;
  Lowerer *pLVar7;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32 [4];
  ValueType baseValueType;
  
  pIVar1 = instr->m_prev;
  func = instr->m_func;
  pLVar7 = (Lowerer *)instr;
  opnd = IR::Instr::UnlinkSrc1(instr);
  baseOpnd = GetRegOpnd(pLVar7,opnd,instr,func,TyUint64);
  local_32[0] = (baseOpnd->super_Opnd).m_valueType.field_0;
  bVar2 = ValueType::IsLikelyArray((ValueType *)&local_32[0].field_0);
  if (!bVar2) {
LAB_0055de31:
    puVar6 = (undefined1 *)__cxa_allocate_exception(1);
    *puVar6 = 0x25;
    __cxa_throw(puVar6,&Js::RejitException::typeinfo,0);
  }
  bVar2 = ValueType::IsLikelyAnyOptimizedArray((ValueType *)&local_32[0].field_0);
  if (bVar2) goto LAB_0055de31;
  bVar2 = ValueType::IsLikelyObject((ValueType *)&local_32[0].field_0);
  if (bVar2) {
    OVar3 = ValueType::GetObjectType((ValueType *)&local_32[0].field_0);
    if (OVar3 == ObjectWithArray) goto LAB_0055de31;
  }
  bVar2 = ValueType::IsUninitialized((ValueType *)&local_32[0].field_0);
  if (!bVar2) {
    bVar2 = ValueType::HasBeenObject((ValueType *)&local_32[0].field_0);
    if (!bVar2) goto LAB_0055de31;
  }
  bVar2 = Func::IsInlinee(this->m_func);
  if (bVar2) goto LAB_0055de31;
  isNotObjectLabel = IR::LabelInstr::New(Label,func,true);
  bVar2 = ValueType::IsArray((ValueType *)&local_32[0].field_0);
  if (!bVar2) {
    GenerateArrayTest(this,baseOpnd,isNotObjectLabel,isNotObjectLabel,instr,false,false,false);
  }
  bVar2 = ValueType::IsArray((ValueType *)&local_32[0].field_0);
  if (bVar2) {
    bVar2 = ValueType::HasNoMissingValues((ValueType *)&local_32[0].field_0);
    if (bVar2) goto LAB_0055dd90;
  }
  pIVar4 = IR::IndirOpnd::New(baseOpnd,0x18,TyUint8,func,false);
  pIVar5 = IR::IntConstOpnd::New(4,TyUint8,func,true);
  InsertTestBranch(&pIVar4->super_Opnd,&pIVar5->super_Opnd,BrEq_A,isNotObjectLabel,instr);
LAB_0055dd90:
  pIVar4 = IR::IndirOpnd::New(baseOpnd,0x20,TyUint32,func,false);
  pLVar7 = (Lowerer *)0xe;
  pIVar5 = IR::IntConstOpnd::New(0xe,TyUint8,func,false);
  InsertCompareBranch(pLVar7,&pIVar4->super_Opnd,&pIVar5->super_Opnd,BrGt_A,true,isNotObjectLabel,
                      instr,false);
  target = IR::LabelInstr::New(Label,func,false);
  InsertBranch(Br,target,instr);
  IR::Instr::InsertBefore(instr,&isNotObjectLabel->super_Instr);
  IR::Instr::InsertAfter(instr,&target->super_Instr);
  GenerateBailOut(this,instr,(BranchInstr *)0x0,(LabelInstr *)0x0,(LabelInstr *)0x0);
  return pIVar1;
}

Assistant:

IR::Instr *
Lowerer::LowerBailOnNotSpreadable(IR::Instr *instr)
{
    // We only avoid bailing out / throwing a rejit exception when the array operand is a simple, non-optimized, non-object array.
    IR::Instr * prevInstr = instr->m_prev;
    Func *func = instr->m_func;

    IR::Opnd *arraySrcOpnd = instr->UnlinkSrc1();
    IR::RegOpnd *arrayOpnd = GetRegOpnd(arraySrcOpnd, instr, func, TyMachPtr);

    const ValueType baseValueType(arrayOpnd->GetValueType());

    // Check if we can just throw a rejit exception based on valuetype alone instead of bailing out.
    if (!baseValueType.IsLikelyArray()
        || baseValueType.IsLikelyAnyOptimizedArray()
        || (baseValueType.IsLikelyObject() && (baseValueType.GetObjectType() == ObjectType::ObjectWithArray))

        // Validate that GenerateArrayTest will not fail.
        || !(baseValueType.IsUninitialized() || baseValueType.HasBeenObject())

        || m_func->IsInlinee())
    {
        throw Js::RejitException(RejitReason::InlineSpreadDisabled);
    }

    // Past this point, we will need to use a bailout.
    IR::LabelInstr *bailOutLabel = IR::LabelInstr::New(Js::OpCode::Label, func, true /* isOpHelper */);

    // See if we can skip various array checks on value type alone
    if (!baseValueType.IsArray())
    {
        GenerateArrayTest(arrayOpnd, bailOutLabel, bailOutLabel, instr, false);
    }
    if (!(baseValueType.IsArray() && baseValueType.HasNoMissingValues()))
    {
        InsertTestBranch(
            IR::IndirOpnd::New(arrayOpnd, Js::JavascriptArray::GetOffsetOfArrayFlags(), TyUint8, func),
            IR::IntConstOpnd::New(static_cast<uint8>(Js::DynamicObjectFlags::HasNoMissingValues), TyUint8, func, true),
            Js::OpCode::BrEq_A,
            bailOutLabel,
            instr);
    }

    IR::IndirOpnd *arrayLenPtrOpnd = IR::IndirOpnd::New(arrayOpnd, Js::JavascriptArray::GetOffsetOfLength(), TyUint32, func);
    InsertCompareBranch(arrayLenPtrOpnd, IR::IntConstOpnd::New(Js::InlineeCallInfo::MaxInlineeArgoutCount - 1, TyUint8, func), Js::OpCode::BrGt_A, true, bailOutLabel, instr);

    IR::LabelInstr *skipBailOutLabel = IR::LabelInstr::New(Js::OpCode::Label, func);
    InsertBranch(Js::OpCode::Br, skipBailOutLabel, instr);

    instr->InsertBefore(bailOutLabel);
    instr->InsertAfter(skipBailOutLabel);

    GenerateBailOut(instr);

    return prevInstr;
}